

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraCodeBlocksGenerator::AppendTarget
          (cmExtraCodeBlocksGenerator *this,cmGeneratedFileStream *fout,string *targetName,
          cmGeneratorTarget *target,char *make,cmLocalGenerator *lg,char *compiler)

{
  undefined8 uVar1;
  bool bVar2;
  TargetType TVar3;
  char *pcVar4;
  ostream *poVar5;
  iterator iVar6;
  ulong uVar7;
  reference pbVar8;
  allocator local_4f9;
  string local_4f8;
  allocator local_4d1;
  string local_4d0;
  string local_4b0;
  allocator local_489;
  string local_488;
  allocator local_461;
  string local_460;
  string local_440;
  allocator local_419;
  string local_418;
  allocator local_3f1;
  string local_3f0;
  string local_3d0;
  allocator local_3a9;
  string local_3a8;
  string local_388;
  _Self local_368;
  _Self local_360;
  const_iterator dirIt;
  undefined1 local_348 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs_1;
  string local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_308;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_300;
  undefined1 local_2f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  string local_2d8;
  undefined1 local_2b8 [8];
  string systemIncludeDirs;
  allocator local_281;
  string local_280;
  undefined1 local_260 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqIncludeDirs;
  undefined1 local_1f8 [8];
  cmXMLSafe safedef;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d0;
  const_iterator di;
  string local_1c0;
  undefined1 local_1a0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cdefs;
  string local_168 [8];
  string location;
  string local_140;
  undefined1 local_120 [8];
  string buildType;
  string local_f8;
  char *local_d8;
  char *executableOutputDir;
  string local_c8;
  char *local_a8;
  char *runtimeOutputDir;
  string local_98 [8];
  string workingDir;
  int cbTargetType;
  allocator local_61;
  string local_60 [8];
  string makefileName;
  cmMakefile *makefile;
  cmLocalGenerator *lg_local;
  char *make_local;
  cmGeneratorTarget *target_local;
  string *targetName_local;
  cmGeneratedFileStream *fout_local;
  cmExtraCodeBlocksGenerator *this_local;
  
  makefileName.field_2._8_8_ = cmLocalGenerator::GetMakefile(lg);
  pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory(lg);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,pcVar4,&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::operator+=(local_60,"/Makefile");
  poVar5 = std::operator<<((ostream *)fout,"      <Target title=\"");
  poVar5 = std::operator<<(poVar5,(string *)targetName);
  std::operator<<(poVar5,"\">\n");
  if (target == (cmGeneratorTarget *)0x0) {
    poVar5 = std::operator<<((ostream *)fout,"         <Option working_dir=\"");
    pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory(lg);
    poVar5 = std::operator<<(poVar5,pcVar4);
    poVar5 = std::operator<<(poVar5,"\" />\n");
    poVar5 = std::operator<<(poVar5,"         <Option type=\"");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,4);
    std::operator<<(poVar5,"\" />\n");
  }
  else {
    workingDir.field_2._8_4_ = GetCBTargetType(this,target);
    pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory(lg);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,pcVar4,(allocator *)((long)&runtimeOutputDir + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&runtimeOutputDir + 7));
    TVar3 = cmGeneratorTarget::GetType(target);
    uVar1 = makefileName.field_2._8_8_;
    if (TVar3 == EXECUTABLE) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_c8,"CMAKE_RUNTIME_OUTPUT_DIRECTORY",
                 (allocator *)((long)&executableOutputDir + 7));
      pcVar4 = cmMakefile::GetDefinition((cmMakefile *)uVar1,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&executableOutputDir + 7));
      uVar1 = makefileName.field_2._8_8_;
      local_a8 = pcVar4;
      if (pcVar4 == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_f8,"EXECUTABLE_OUTPUT_PATH",
                   (allocator *)(buildType.field_2._M_local_buf + 0xf));
        pcVar4 = cmMakefile::GetDefinition((cmMakefile *)uVar1,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator((allocator<char> *)(buildType.field_2._M_local_buf + 0xf));
        local_d8 = pcVar4;
        if (pcVar4 != (char *)0x0) {
          std::__cxx11::string::operator=(local_98,pcVar4);
        }
      }
      else {
        std::__cxx11::string::operator=(local_98,pcVar4);
      }
    }
    uVar1 = makefileName.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_140,"CMAKE_BUILD_TYPE",
               (allocator *)(location.field_2._M_local_buf + 0xf));
    pcVar4 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar1,&local_140);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_120,pcVar4,(allocator *)(location.field_2._M_local_buf + 0xe));
    std::allocator<char>::~allocator((allocator<char> *)(location.field_2._M_local_buf + 0xe));
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator((allocator<char> *)(location.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string(local_168);
    TVar3 = cmGeneratorTarget::GetType(target);
    if (TVar3 == OBJECT_LIBRARY) {
      CreateDummyTargetFile_abi_cxx11_
                ((string *)
                 &cdefs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,this,lg,target);
      std::__cxx11::string::operator=
                (local_168,
                 (string *)
                 &cdefs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &cdefs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      pcVar4 = cmGeneratorTarget::GetLocation(target,(string *)local_120);
      std::__cxx11::string::operator=(local_168,pcVar4);
    }
    poVar5 = std::operator<<((ostream *)fout,"         <Option output=\"");
    poVar5 = std::operator<<(poVar5,local_168);
    poVar5 = std::operator<<(poVar5,
                             "\" prefix_auto=\"0\" extension_auto=\"0\" />\n         <Option working_dir=\""
                            );
    poVar5 = std::operator<<(poVar5,local_98);
    poVar5 = std::operator<<(poVar5,
                             "\" />\n         <Option object_output=\"./\" />\n         <Option type=\""
                            );
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,workingDir.field_2._8_4_);
    poVar5 = std::operator<<(poVar5,"\" />\n         <Option compiler=\"");
    poVar5 = std::operator<<(poVar5,compiler);
    std::operator<<(poVar5,"\" />\n         <Compiler>\n");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1c0,"C",(allocator *)((long)&di._M_current + 7));
    cmGeneratorTarget::GetCompileDefinitions
              (target,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1a0,(string *)local_120,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&di._M_current + 7));
    local_1d8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1a0);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_1d0,&local_1d8);
    while( true ) {
      safedef._16_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1a0);
      bVar2 = __gnu_cxx::operator!=
                        (&local_1d0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&safedef.DoQuotes);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_1d0);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmXMLSafe::cmXMLSafe((cmXMLSafe *)local_1f8,pcVar4);
      poVar5 = std::operator<<((ostream *)fout,"            <Add option=\"-D");
      cmXMLSafe::str_abi_cxx11_
                ((string *)&uniqIncludeDirs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (cmXMLSafe *)local_1f8);
      poVar5 = std::operator<<(poVar5,(string *)
                                      &uniqIncludeDirs._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count);
      std::operator<<(poVar5,"\" />\n");
      std::__cxx11::string::~string
                ((string *)&uniqIncludeDirs._M_t._M_impl.super__Rb_tree_header._M_node_count);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_1d0);
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&includes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_260);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_280,"C",&local_281);
    cmLocalGenerator::GetIncludeDirectories
              (lg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_260,target,&local_280,(string *)local_120,true);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator((allocator<char> *)&local_281);
    iVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_260);
    systemIncludeDirs.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_260);
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&includes.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )iVar6._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )systemIncludeDirs.field_2._8_8_);
    uVar1 = makefileName.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2d8,"CMAKE_EXTRA_GENERATOR_C_SYSTEM_INCLUDE_DIRS",
               (allocator *)
               ((long)&dirs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar4 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar1,&local_2d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_2b8,pcVar4,
               (allocator *)
               ((long)&dirs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&dirs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&dirs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2f8);
      cmSystemTools::ExpandListArgument
                ((string *)local_2b8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2f8,false);
      local_300._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2f8);
      local_308 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_2f8);
      std::
      set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,local_300,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_308);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2f8);
    }
    uVar1 = makefileName.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_328,"CMAKE_EXTRA_GENERATOR_CXX_SYSTEM_INCLUDE_DIRS",
               (allocator *)
               ((long)&dirs_1.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar4 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar1,&local_328);
    std::__cxx11::string::operator=((string *)local_2b8,pcVar4);
    std::__cxx11::string::~string((string *)&local_328);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&dirs_1.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_348);
      cmSystemTools::ExpandListArgument
                ((string *)local_2b8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_348,false);
      iVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_348);
      dirIt._M_node =
           (_Base_ptr)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_348);
      std::
      set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )iVar6._M_current,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )dirIt._M_node);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_348);
    }
    local_360._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      local_368._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar2 = std::operator!=(&local_360,&local_368);
      if (!bVar2) break;
      poVar5 = std::operator<<((ostream *)fout,"            <Add directory=\"");
      pbVar8 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_360);
      poVar5 = std::operator<<(poVar5,(string *)pbVar8);
      std::operator<<(poVar5,"\" />\n");
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_360);
    }
    std::operator<<((ostream *)fout,"         </Compiler>\n");
    std::__cxx11::string::~string((string *)local_2b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_260);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&includes.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a0);
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::string::~string(local_98);
  }
  poVar5 = std::operator<<((ostream *)fout,"         <MakeCommands>\n            <Build command=\"")
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3a8,make,&local_3a9);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  BuildMakeCommand(&local_388,this,&local_3a8,pcVar4,targetName);
  poVar5 = std::operator<<(poVar5,(string *)&local_388);
  poVar5 = std::operator<<(poVar5,"\" />\n            <CompileFile command=\"");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3f0,make,&local_3f1);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_418,"&quot;$file&quot;",&local_419);
  BuildMakeCommand(&local_3d0,this,&local_3f0,pcVar4,&local_418);
  poVar5 = std::operator<<(poVar5,(string *)&local_3d0);
  poVar5 = std::operator<<(poVar5,"\" />\n            <Clean command=\"");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_460,make,&local_461);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_488,"clean",&local_489);
  BuildMakeCommand(&local_440,this,&local_460,pcVar4,&local_488);
  poVar5 = std::operator<<(poVar5,(string *)&local_440);
  poVar5 = std::operator<<(poVar5,"\" />\n            <DistClean command=\"");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4d0,make,&local_4d1);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4f8,"clean",&local_4f9);
  BuildMakeCommand(&local_4b0,this,&local_4d0,pcVar4,&local_4f8);
  poVar5 = std::operator<<(poVar5,(string *)&local_4b0);
  std::operator<<(poVar5,"\" />\n         </MakeCommands>\n      </Target>\n");
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator::AppendTarget(cmGeneratedFileStream& fout,
                                              const std::string& targetName,
                                              cmGeneratorTarget* target,
                                              const char* make,
                                              const cmLocalGenerator* lg,
                                              const char* compiler)
{
  cmMakefile const* makefile = lg->GetMakefile();
  std::string makefileName = lg->GetCurrentBinaryDirectory();
  makefileName += "/Makefile";

  fout<<"      <Target title=\"" << targetName << "\">\n";
  if (target!=0)
    {
    int cbTargetType = this->GetCBTargetType(target);
    std::string workingDir = lg->GetCurrentBinaryDirectory();
    if ( target->GetType()==cmState::EXECUTABLE)
      {
      // Determine the directory where the executable target is created, and
      // set the working directory to this dir.
      const char* runtimeOutputDir = makefile->GetDefinition(
                                             "CMAKE_RUNTIME_OUTPUT_DIRECTORY");
      if (runtimeOutputDir != 0)
        {
        workingDir = runtimeOutputDir;
        }
      else
        {
        const char* executableOutputDir = makefile->GetDefinition(
                                                     "EXECUTABLE_OUTPUT_PATH");
        if (executableOutputDir != 0)
          {
          workingDir = executableOutputDir;
          }
        }
      }

    std::string buildType = makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
    std::string location;
    if ( target->GetType()==cmState::OBJECT_LIBRARY)
      {
      location = this->CreateDummyTargetFile(const_cast<cmLocalGenerator*>(lg),
                                             target);
      }
    else
      {
      location = target->GetLocation(buildType);
      }

    fout<<"         <Option output=\"" << location
                            << "\" prefix_auto=\"0\" extension_auto=\"0\" />\n"
          "         <Option working_dir=\"" << workingDir << "\" />\n"
          "         <Option object_output=\"./\" />\n"
          "         <Option type=\"" << cbTargetType << "\" />\n"
          "         <Option compiler=\"" << compiler << "\" />\n"
          "         <Compiler>\n";

    // the compilerdefines for this target
    std::vector<std::string> cdefs;
    target->GetCompileDefinitions(cdefs, buildType, "C");

    // Expand the list.
    for(std::vector<std::string>::const_iterator di = cdefs.begin();
        di != cdefs.end(); ++di)
      {
      cmXMLSafe safedef(di->c_str());
      fout <<"            <Add option=\"-D" << safedef.str() << "\" />\n";
      }

    // the include directories for this target
    std::set<std::string> uniqIncludeDirs;

    std::vector<std::string> includes;
    lg->GetIncludeDirectories(includes, target, "C", buildType);

    uniqIncludeDirs.insert(includes.begin(), includes.end());

    std::string systemIncludeDirs = makefile->GetSafeDefinition(
                              "CMAKE_EXTRA_GENERATOR_C_SYSTEM_INCLUDE_DIRS");
    if (!systemIncludeDirs.empty())
      {
      std::vector<std::string> dirs;
      cmSystemTools::ExpandListArgument(systemIncludeDirs, dirs);
      uniqIncludeDirs.insert(dirs.begin(), dirs.end());
      }

    systemIncludeDirs = makefile->GetSafeDefinition(
                            "CMAKE_EXTRA_GENERATOR_CXX_SYSTEM_INCLUDE_DIRS");
    if (!systemIncludeDirs.empty())
      {
      std::vector<std::string> dirs;
      cmSystemTools::ExpandListArgument(systemIncludeDirs, dirs);
      uniqIncludeDirs.insert(dirs.begin(), dirs.end());
      }

    for(std::set<std::string>::const_iterator dirIt=uniqIncludeDirs.begin();
        dirIt != uniqIncludeDirs.end();
        ++dirIt)
      {
      fout <<"            <Add directory=\"" << *dirIt << "\" />\n";
      }

    fout<<"         </Compiler>\n";
    }
  else // e.g. all and the GLOBAL and UTILITY targets
    {
    fout<<"         <Option working_dir=\""
        << lg->GetCurrentBinaryDirectory() << "\" />\n"
        <<"         <Option type=\"" << 4 << "\" />\n";
    }

  fout<<"         <MakeCommands>\n"
        "            <Build command=\""
      << this->BuildMakeCommand(make, makefileName.c_str(), targetName)
      << "\" />\n"
        "            <CompileFile command=\""
      << this->BuildMakeCommand(make, makefileName.c_str(),"&quot;$file&quot;")
      << "\" />\n"
        "            <Clean command=\""
      << this->BuildMakeCommand(make, makefileName.c_str(), "clean")
      << "\" />\n"
        "            <DistClean command=\""
      << this->BuildMakeCommand(make, makefileName.c_str(), "clean")
      << "\" />\n"
        "         </MakeCommands>\n"
        "      </Target>\n";

}